

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nextval.cpp
# Opt level: O3

unique_ptr<duckdb::FunctionLocalState,_std::default_delete<duckdb::FunctionLocalState>,_true>
__thiscall
duckdb::NextValLocalFunction
          (duckdb *this,ExpressionState *state,BoundFunctionExpression *expr,FunctionData *bind_data
          )

{
  _func_int **pp_Var1;
  ClientContext *context;
  DuckTransaction *pDVar2;
  undefined8 *puVar3;
  
  if (bind_data == (FunctionData *)0x0) {
    puVar3 = (undefined8 *)0x0;
  }
  else {
    context = ExpressionState::GetContext(state);
    pp_Var1 = bind_data[1]._vptr_FunctionData;
    pDVar2 = DuckTransaction::Get(context,(Catalog *)pp_Var1[0x1b]);
    puVar3 = (undefined8 *)operator_new(0x18);
    *puVar3 = &PTR__FunctionLocalState_01982c68;
    puVar3[1] = pDVar2;
    puVar3[2] = pp_Var1;
  }
  *(undefined8 **)this = puVar3;
  return (unique_ptr<duckdb::FunctionLocalState,_std::default_delete<duckdb::FunctionLocalState>_>)
         (unique_ptr<duckdb::FunctionLocalState,_std::default_delete<duckdb::FunctionLocalState>_>)
         this;
}

Assistant:

unique_ptr<FunctionLocalState> NextValLocalFunction(ExpressionState &state, const BoundFunctionExpression &expr,
                                                    FunctionData *bind_data) {
	if (!bind_data) {
		return nullptr;
	}
	auto &context = state.GetContext();
	auto &info = bind_data->Cast<NextvalBindData>();
	auto &sequence = info.sequence;
	auto &transaction = DuckTransaction::Get(context, sequence.catalog);
	return make_uniq<NextValLocalState>(transaction, sequence);
}